

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::ParseFromFileDescriptor(MessageLite *this,int file_descriptor)

{
  bool bVar1;
  FileInputStream input;
  FileInputStream *local_70;
  FileInputStream local_68;
  
  io::FileInputStream::FileInputStream(&local_68,file_descriptor,-1);
  local_70 = &local_68;
  bVar1 = ParseFrom<(google::protobuf::MessageLite::ParseFlags)1,google::protobuf::io::ZeroCopyInputStream*>
                    (this,(ZeroCopyInputStream **)&local_70);
  io::CopyingInputStreamAdaptor::~CopyingInputStreamAdaptor(&local_68.impl_);
  io::FileInputStream::CopyingFileInputStream::~CopyingFileInputStream(&local_68.copying_input_);
  return bVar1 && local_68.copying_input_.errno_ == 0;
}

Assistant:

bool MessageLite::ParseFromFileDescriptor(int file_descriptor) {
  io::FileInputStream input(file_descriptor);
  return ParseFromZeroCopyStream(&input) && input.GetErrno() == 0;
}